

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcap.c
# Opt level: O2

void stringcap(luaL_Buffer *b,CapState *cs)

{
  lua_State *L;
  char *s;
  Capture *pCVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  size_t len;
  StrAux cps [10];
  
  L = cs->L;
  iVar3 = updatecache(cs,(uint)cs->cap->idx);
  pcVar5 = lua_tolstring(L,iVar3,&len);
  iVar3 = getstrcaps(cs,cps,0);
  for (uVar7 = 0; uVar7 < len; uVar7 = uVar7 + 1) {
    cVar2 = pcVar5[uVar7];
    if (cVar2 == '%') {
      cVar2 = pcVar5[uVar7 + 1];
      uVar7 = uVar7 + 1;
      if ((byte)(cVar2 - 0x3aU) < 0xf6) {
        uVar6 = b->n;
        if (b->size <= uVar6) {
          luaL_prepbuffsize(b,1);
          cVar2 = pcVar5[uVar7];
          uVar6 = b->n;
        }
        b->n = uVar6 + 1;
        b->b[uVar6] = cVar2;
      }
      else {
        uVar8 = (uint)(byte)(cVar2 - 0x30U);
        if ((int)(uint)(byte)(cVar2 - 0x30U) < iVar3) {
          if (cps[uVar8].isstring == 0) {
            pCVar1 = cs->cap;
            cs->cap = cps[uVar8].u.cp;
            iVar4 = addonestring(b,cs,"capture");
            if (iVar4 == 0) {
              luaL_error(cs->L,"no values in capture index %d",(ulong)uVar8);
            }
            cs->cap = pCVar1;
          }
          else {
            s = cps[uVar8].u.s.s;
            luaL_addlstring(b,s,(long)cps[uVar8].u.s.e - (long)s);
          }
        }
        else {
          luaL_error(cs->L,"invalid capture index (%d)",(ulong)uVar8);
        }
      }
    }
    else {
      uVar6 = b->n;
      if (b->size <= uVar6) {
        luaL_prepbuffsize(b,1);
        cVar2 = pcVar5[uVar7];
        uVar6 = b->n;
      }
      b->n = uVar6 + 1;
      b->b[uVar6] = cVar2;
    }
  }
  return;
}

Assistant:

static void stringcap (luaL_Buffer *b, CapState *cs) {
  StrAux cps[MAXSTRCAPS];
  int n;
  size_t len, i;
  const char *fmt;  /* format string */
  fmt = lua_tolstring(cs->L, updatecache(cs, cs->cap->idx), &len);
  n = getstrcaps(cs, cps, 0) - 1;  /* collect nested captures */
  for (i = 0; i < len; i++) {  /* traverse them */
    if (fmt[i] != '%')  /* not an escape? */
      luaL_addchar(b, fmt[i]);  /* add it to buffer */
    else if (fmt[++i] < '0' || fmt[i] > '9')  /* not followed by a digit? */
      luaL_addchar(b, fmt[i]);  /* add to buffer */
    else {
      int l = fmt[i] - '0';  /* capture index */
      if (l > n)
        luaL_error(cs->L, "invalid capture index (%d)", l);
      else if (cps[l].isstring)
        luaL_addlstring(b, cps[l].u.s.s, cps[l].u.s.e - cps[l].u.s.s);
      else {
        Capture *curr = cs->cap;
        cs->cap = cps[l].u.cp;  /* go back to evaluate that nested capture */
        if (!addonestring(b, cs, "capture"))
          luaL_error(cs->L, "no values in capture index %d", l);
        cs->cap = curr;  /* continue from where it stopped */
      }
    }
  }
}